

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_assertion_tests.cpp
# Opt level: O2

void string_does_not_contain_stl_string_pointer(void)

{
  string *this;
  Constraint *constraint;
  allocator local_11;
  
  this = (string *)operator_new(0x20);
  std::__cxx11::string::string((string *)this,"bob",&local_11);
  bob_pointer_abi_cxx11_ = this;
  constraint = (Constraint *)
               cgreen::create_does_not_contain_string_constraint((string *)this,"bob_pointer");
  cgreen::assert_that_<char_const*>
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/cpp_assertion_tests.cpp"
             ,0x61,"\"alice\"","alice",constraint);
  return;
}

Assistant:

Ensure(string_does_not_contain_stl_string_pointer) {
    bob_pointer = new std::string("bob");
    assert_that("alice", does_not_contain_string(bob_pointer));
}